

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalc.cpp
# Opt level: O0

void __thiscall
aalcalc::outputresultscsv_new
          (aalcalc *this,vector<aal_rec_ensemble,_std::allocator<aal_rec_ensemble>_> *vec_aal)

{
  uint uVar1;
  uint uVar2;
  undefined8 uVar3;
  double dVar4;
  bool bVar5;
  int strLen_00;
  pointer paVar6;
  reference pvVar7;
  reference record;
  char local_1048 [4];
  int strLen;
  char buffer [4096];
  double sd_dev;
  double mean;
  int local_30;
  int p2;
  int p1;
  int sample_size;
  __normal_iterator<const_aal_rec_ensemble_*,_std::vector<aal_rec_ensemble,_std::allocator<aal_rec_ensemble>_>_>
  local_20;
  const_iterator v_iter;
  vector<aal_rec_ensemble,_std::allocator<aal_rec_ensemble>_> *vec_aal_local;
  aalcalc *this_local;
  
  v_iter._M_current = (aal_rec_ensemble *)vec_aal;
  local_20._M_current =
       (aal_rec_ensemble *)
       std::vector<aal_rec_ensemble,_std::allocator<aal_rec_ensemble>_>::begin(vec_aal);
  while( true ) {
    _p1 = std::vector<aal_rec_ensemble,_std::allocator<aal_rec_ensemble>_>::end(v_iter._M_current);
    bVar5 = __gnu_cxx::operator!=
                      (&local_20,
                       (__normal_iterator<const_aal_rec_ensemble_*,_std::vector<aal_rec_ensemble,_std::allocator<aal_rec_ensemble>_>_>
                        *)&p1);
    if (!bVar5) break;
    paVar6 = __gnu_cxx::
             __normal_iterator<const_aal_rec_ensemble_*,_std::vector<aal_rec_ensemble,_std::allocator<aal_rec_ensemble>_>_>
             ::operator->(&local_20);
    if (0 < (paVar6->super_aal_rec).summary_id) {
      paVar6 = __gnu_cxx::
               __normal_iterator<const_aal_rec_ensemble_*,_std::vector<aal_rec_ensemble,_std::allocator<aal_rec_ensemble>_>_>
               ::operator->(&local_20);
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->ensemblecount_,(long)paVar6->ensemble_id);
      p2 = *pvVar7;
      local_30 = this->no_of_periods_ * p2;
      mean._4_4_ = local_30 + -1;
      record = __gnu_cxx::
               __normal_iterator<const_aal_rec_ensemble_*,_std::vector<aal_rec_ensemble,_std::allocator<aal_rec_ensemble>_>_>
               ::operator*(&local_20);
      calculatemeansddev<aal_rec_ensemble>
                (this,record,p2,local_30,mean._4_4_,this->no_of_periods_,&sd_dev,
                 (double *)(buffer + 0xff8));
      paVar6 = __gnu_cxx::
               __normal_iterator<const_aal_rec_ensemble_*,_std::vector<aal_rec_ensemble,_std::allocator<aal_rec_ensemble>_>_>
               ::operator->(&local_20);
      uVar1 = (paVar6->super_aal_rec).summary_id;
      paVar6 = __gnu_cxx::
               __normal_iterator<const_aal_rec_ensemble_*,_std::vector<aal_rec_ensemble,_std::allocator<aal_rec_ensemble>_>_>
               ::operator->(&local_20);
      dVar4 = sd_dev;
      uVar3 = buffer._4088_8_;
      uVar2 = (paVar6->super_aal_rec).type;
      paVar6 = __gnu_cxx::
               __normal_iterator<const_aal_rec_ensemble_*,_std::vector<aal_rec_ensemble,_std::allocator<aal_rec_ensemble>_>_>
               ::operator->(&local_20);
      strLen_00 = sprintf(local_1048,"%d,%d,%f,%f,%d\n",dVar4,uVar3,(ulong)uVar1,(ulong)uVar2,
                          (ulong)(uint)paVar6->ensemble_id);
      outputrows(this,local_1048,strLen_00,_stdout);
    }
    __gnu_cxx::
    __normal_iterator<const_aal_rec_ensemble_*,_std::vector<aal_rec_ensemble,_std::allocator<aal_rec_ensemble>_>_>
    ::operator++(&local_20,0);
  }
  return;
}

Assistant:

void aalcalc::outputresultscsv_new(const std::vector<aal_rec_ensemble> &vec_aal)
{
	auto v_iter = vec_aal.begin();
	while (v_iter != vec_aal.end()) {

		if(v_iter->summary_id > 0) {

			int sample_size = ensemblecount_[v_iter->ensemble_id];
			int p1 = no_of_periods_ * sample_size;
			int p2 = p1 - 1;
			double mean, sd_dev;
			calculatemeansddev(*v_iter, sample_size, p1, p2,
					   no_of_periods_, mean, sd_dev);

			char buffer[4096];
			int strLen;
			strLen = sprintf(buffer, "%d,%d,%f,%f,%d\n",
					v_iter->summary_id, v_iter->type,
					mean, sd_dev, v_iter->ensemble_id);
			outputrows(buffer, strLen);

		}

		v_iter++;

	}
}